

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,sockaddr *addr,uint addrlen,uint flags)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  _func_int **pp_Var3;
  PromiseArena *pPVar4;
  AsyncIoStream *pAVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  void *pvVar11;
  undefined4 in_register_0000000c;
  int iVar12;
  LowLevelAsyncIoProviderImpl *pLVar13;
  TransformPromiseNodeBase *this_00;
  int __fd;
  undefined4 in_register_00000034;
  Promise<void> connected;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> result;
  String address;
  Fault f;
  UnixEventPort *local_110;
  undefined1 local_108 [8];
  _func_int **local_100;
  PromiseArena *local_f8;
  Fault local_f0;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_e8;
  String local_d8;
  uint local_c0;
  int local_bc;
  UnixEventPort *local_b8;
  anon_union_128_5_6547fd28_for_addr aStack_b0;
  
  __fd = (int)addr;
  local_b8 = (UnixEventPort *)CONCAT44(local_b8._4_4_,3);
  local_bc = __fd;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)&local_100,*(UnixEventPort **)(CONCAT44(in_register_00000034,fd) + 8),&local_bc,
             &local_c0,(Flags *)&local_b8);
  local_110 = (UnixEventPort *)(this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider;
  pLVar13 = this;
  do {
    iVar8 = ::connect(__fd,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),flags);
    if (-1 < iVar8) goto LAB_0044c6c4;
    puVar10 = (uint *)__errno_location();
    uVar9 = *puVar10;
    pLVar13 = (LowLevelAsyncIoProviderImpl *)(ulong)uVar9;
    if (uVar9 == 4) {
      iVar8 = 0;
    }
    else {
      iVar8 = 2;
      if (uVar9 != 0x73) {
        SocketAddress::SocketAddress
                  ((SocketAddress *)&local_b8,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),
                   flags);
        SocketAddress::toString(&local_d8,(SocketAddress *)&local_b8);
        kj::_::Debug::Fault::Fault<int,kj::String&>
                  ((Fault *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x5e5,uVar9,"connect()","address",&local_d8);
        kj::_::Debug::Fault::~Fault((Fault *)&local_b8);
        local_e8.disposer = (Disposer *)0x0;
        local_e8.ptr = (AsyncIoStream *)0x0;
        kj::_::PromiseDisposer::
        alloc<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                  ((PromiseDisposer *)&local_b8,&local_e8);
        pAVar5 = local_e8.ptr;
        local_110 = local_b8;
        if (local_e8.ptr != (AsyncIoStream *)0x0) {
          local_e8.ptr = (AsyncIoStream *)0x0;
          (**(local_e8.disposer)->_vptr_Disposer)
                    (local_e8.disposer,
                     (pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                     (long)&(pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream);
        }
        sVar7 = local_d8.content.size_;
        pcVar6 = local_d8.content.ptr;
        if ((pollfd)local_d8.content.ptr != (pollfd)0x0) {
          local_d8.content.ptr = (char *)0x0;
          local_d8.content.size_ = 0;
          (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                    (local_d8.content.disposer,pcVar6,1,sVar7,sVar7,0);
        }
        iVar8 = 1;
      }
    }
  } while (iVar8 == 0);
  if (iVar8 == 2) {
LAB_0044c6c4:
    pPVar4 = local_f8;
    (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = (_func_int **)local_110;
    local_d8.content.ptr = (char *)(ulong)CONCAT24(4,*(undefined4 *)(local_f8->bytes + 0x10));
    do {
      iVar8 = poll((pollfd *)&local_d8,1,0);
      if (-1 < iVar8) {
        iVar12 = 0;
        break;
      }
      uVar9 = kj::_::Debug::getOsErrorNumber(false);
      pLVar13 = (LowLevelAsyncIoProviderImpl *)((ulong)pLVar13 & 0xffffffff);
      if (uVar9 != 0xffffffff) {
        pLVar13 = (LowLevelAsyncIoProviderImpl *)(ulong)uVar9;
      }
      iVar12 = (int)pLVar13;
    } while (uVar9 == 0xffffffff);
    if (iVar12 != 0) {
      local_f0.exception = (Exception *)0x0;
      local_b8 = (UnixEventPort *)0x0;
      aStack_b0._0_8_ = 0;
      kj::_::Debug::Fault::init
                (&local_f0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_f0);
    }
    if (iVar8 == 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_108);
    }
    else {
      kj::_::readyNow();
      local_108 = (undefined1  [8])local_b8;
    }
    pp_Var3 = local_100;
    auVar2 = local_108;
    local_f8 = (PromiseArena *)0x0;
    pPVar1 = (PromiseArena *)
             ((SleepHooks *)&((PromiseArenaMember *)local_108)->arena)->_vptr_SleepHooks;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_108 - (long)pPVar1) < 0x38) {
      pvVar11 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3c8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_108,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1519:27)>
                 ::anon_class_24_2_651ff19b_for_func::operator());
      *(undefined ***)((long)pvVar11 + 0x3c8) = &PTR_destroy_0064a238;
      *(int *)((long)pvVar11 + 1000) = __fd;
      *(_func_int ***)((long)pvVar11 + 0x3f0) = pp_Var3;
      *(PromiseArena **)((long)pvVar11 + 0x3f8) = pPVar4;
      *(void **)((long)pvVar11 + 0x3d0) = pvVar11;
    }
    else {
      ((SleepHooks *)&((PromiseArenaMember *)local_108)->arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)((long)local_108 + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_108,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1519:27)>
                 ::anon_class_24_2_651ff19b_for_func::operator());
      ((PromiseArenaMember *)((long)auVar2 + -0x40))->arena = (PromiseArena *)&PTR_destroy_0064a238;
      *(int *)&((PromiseArenaMember *)((long)auVar2 + -0x20))->arena = __fd;
      ((PromiseArenaMember *)((long)auVar2 + -0x10))->_vptr_PromiseArenaMember = pp_Var3;
      ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = pPVar4;
      ((PromiseArenaMember *)((long)auVar2 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar1;
    }
    auVar2 = local_108;
    (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = (_func_int **)this_00;
    if (local_108 != (undefined1  [8])0x0) {
      local_108 = (undefined1  [8])0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
    }
  }
  else {
    (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = (_func_int **)local_110;
  }
  pPVar4 = local_f8;
  if (local_f8 != (PromiseArena *)0x0) {
    local_f8 = (PromiseArena *)0x0;
    (**(code **)*local_100)(local_100,pPVar4->bytes + *(long *)(*(long *)pPVar4->bytes + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> wrapConnectingSocketFd(
      int fd, const struct sockaddr* addr, uint addrlen, uint flags = 0) override {
    // It's important that we construct the AsyncStreamFd first, so that `flags` are honored,
    // especially setting nonblocking mode and taking ownership.
    auto result = heap<AsyncStreamFd>(eventPort, fd, flags,
                                      UnixEventPort::FdObserver::OBSERVE_READ_WRITE);

    // Unfortunately connect() doesn't fit the mold of KJ_NONBLOCKING_SYSCALL, since it indicates
    // non-blocking using EINPROGRESS.
    for (;;) {
      if (::connect(fd, addr, addrlen) < 0) {
        int error = errno;
        if (error == EINPROGRESS) {
          // Fine.
          break;
        } else if (error != EINTR) {
          auto address = SocketAddress(addr, addrlen).toString();
          KJ_FAIL_SYSCALL("connect()", error, address) { break; }
          return Own<AsyncIoStream>();
        }
      } else {
        // no error
        break;
      }
    }

    auto connected = result->waitConnected();
    return connected.then([fd,stream=kj::mv(result)]() mutable -> Own<AsyncIoStream> {
      int err;
      socklen_t errlen = sizeof(err);
      KJ_SYSCALL(getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen));
      if (err != 0) {
        KJ_FAIL_SYSCALL("connect()", err) { break; }
      }
      return kj::mv(stream);
    });
  }